

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConeRecord2.cpp
# Opt level: O0

void __thiscall KDIS::DATA_TYPE::ConeRecord2::Encode(ConeRecord2 *this,KDataStream *stream)

{
  KDataStream *pKVar1;
  KDataStream *stream_local;
  ConeRecord2 *this_local;
  
  pKVar1 = KDataStream::operator<<
                     (stream,(this->super_ConeRecord1).super_EnvironmentRecord.m_ui32EnvRecTyp);
  pKVar1 = KDataStream::operator<<
                     (pKVar1,(this->super_ConeRecord1).super_EnvironmentRecord.m_ui16Length);
  pKVar1 = KDataStream::operator<<
                     (pKVar1,(this->super_ConeRecord1).super_EnvironmentRecord.m_ui8Index);
  pKVar1 = KDataStream::operator<<
                     (pKVar1,(this->super_ConeRecord1).super_EnvironmentRecord.m_ui8Padding);
  pKVar1 = DATA_TYPE::operator<<(pKVar1,&(this->super_ConeRecord1).m_Loc.super_DataTypeBase);
  pKVar1 = DATA_TYPE::operator<<(pKVar1,&(this->super_ConeRecord1).m_Ori.super_DataTypeBase);
  pKVar1 = DATA_TYPE::operator<<(pKVar1,&(this->m_Velocity).super_DataTypeBase);
  pKVar1 = DATA_TYPE::operator<<(pKVar1,&(this->m_AngularVelocity).super_DataTypeBase);
  pKVar1 = KDataStream::operator<<(pKVar1,(float)(this->super_ConeRecord1).m_f32Height);
  pKVar1 = KDataStream::operator<<(pKVar1,(float)this->m_f32ddtHeight);
  pKVar1 = KDataStream::operator<<(pKVar1,(float)(this->super_ConeRecord1).m_f32PeakAngle);
  pKVar1 = KDataStream::operator<<(pKVar1,(float)this->m_f32ddtPeak);
  KDataStream::operator<<(pKVar1,(this->super_ConeRecord1).m_ui32Padding);
  return;
}

Assistant:

void ConeRecord2::Encode( KDataStream & stream ) const
{
    stream << m_ui32EnvRecTyp
           << m_ui16Length
           << m_ui8Index
           << m_ui8Padding
           << KDIS_STREAM m_Loc
           << KDIS_STREAM m_Ori
           << KDIS_STREAM m_Velocity
           << KDIS_STREAM m_AngularVelocity
           << m_f32Height
           << m_f32ddtHeight
           << m_f32PeakAngle
           << m_f32ddtPeak
           << m_ui32Padding;
}